

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::PrimReserve(ImDrawList *this,int idx_count,int vtx_count)

{
  int *piVar1;
  ImDrawCmd *pIVar2;
  int iVar3;
  ImDrawVert *__dest;
  unsigned_short *__dest_00;
  ImGuiContext *pIVar4;
  ImDrawVert *pIVar5;
  unsigned_short *puVar6;
  int iVar7;
  int iVar8;
  
  pIVar2 = (this->CmdBuffer).Data + (long)(this->CmdBuffer).Size + -1;
  pIVar2->ElemCount = pIVar2->ElemCount + idx_count;
  pIVar4 = GImGui;
  iVar3 = (this->VtxBuffer).Size;
  iVar8 = vtx_count + iVar3;
  iVar7 = (this->VtxBuffer).Capacity;
  if (iVar7 < iVar8) {
    if (iVar7 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar7 / 2 + iVar7;
    }
    if (iVar7 <= iVar8) {
      iVar7 = iVar8;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest = (ImDrawVert *)(*(pIVar4->IO).MemAllocFn)((long)iVar7 * 0x14);
    pIVar5 = (this->VtxBuffer).Data;
    if (pIVar5 == (ImDrawVert *)0x0) {
LAB_0014c62d:
      pIVar5 = (ImDrawVert *)0x0;
      pIVar4 = GImGui;
    }
    else {
      memcpy(__dest,pIVar5,(long)(this->VtxBuffer).Size * 0x14);
      pIVar4 = GImGui;
      pIVar5 = (this->VtxBuffer).Data;
      if (pIVar5 == (ImDrawVert *)0x0) goto LAB_0014c62d;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar4->IO).MemFreeFn)(pIVar5);
    (this->VtxBuffer).Data = __dest;
    (this->VtxBuffer).Capacity = iVar7;
  }
  else {
    __dest = (this->VtxBuffer).Data;
  }
  (this->VtxBuffer).Size = iVar8;
  this->_VtxWritePtr = __dest + iVar3;
  pIVar4 = GImGui;
  iVar3 = (this->IdxBuffer).Size;
  iVar8 = idx_count + iVar3;
  iVar7 = (this->IdxBuffer).Capacity;
  if (iVar8 <= iVar7) {
    __dest_00 = (this->IdxBuffer).Data;
    goto LAB_0014c6e7;
  }
  if (iVar7 == 0) {
    iVar7 = 8;
  }
  else {
    iVar7 = iVar7 / 2 + iVar7;
  }
  if (iVar7 <= iVar8) {
    iVar7 = iVar8;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest_00 = (unsigned_short *)(*(pIVar4->IO).MemAllocFn)((long)iVar7 * 2);
  puVar6 = (this->IdxBuffer).Data;
  if (puVar6 == (unsigned_short *)0x0) {
LAB_0014c6d7:
    puVar6 = (unsigned_short *)0x0;
    pIVar4 = GImGui;
  }
  else {
    memcpy(__dest_00,puVar6,(long)(this->IdxBuffer).Size * 2);
    pIVar4 = GImGui;
    puVar6 = (this->IdxBuffer).Data;
    if (puVar6 == (unsigned_short *)0x0) goto LAB_0014c6d7;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar4->IO).MemFreeFn)(puVar6);
  (this->IdxBuffer).Data = __dest_00;
  (this->IdxBuffer).Capacity = iVar7;
LAB_0014c6e7:
  (this->IdxBuffer).Size = iVar8;
  this->_IdxWritePtr = __dest_00 + iVar3;
  return;
}

Assistant:

void ImDrawList::PrimReserve(int idx_count, int vtx_count)
{
    ImDrawCmd& draw_cmd = CmdBuffer.Data[CmdBuffer.Size-1];
    draw_cmd.ElemCount += idx_count;

    int vtx_buffer_size = VtxBuffer.Size;
    VtxBuffer.resize(vtx_buffer_size + vtx_count);
    _VtxWritePtr = VtxBuffer.Data + vtx_buffer_size;

    int idx_buffer_size = IdxBuffer.Size;
    IdxBuffer.resize(idx_buffer_size + idx_count);
    _IdxWritePtr = IdxBuffer.Data + idx_buffer_size;
}